

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderStairs<ImPlot::GetterYs<double>,ImPlot::TransformerLogLog>
               (GetterYs<double> *getter,TransformerLogLog *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImPlotPlot *pIVar6;
  float fVar7;
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  ImDrawList *this;
  int iVar10;
  int iVar11;
  ImPlotContext *gp;
  float fVar12;
  double dVar13;
  double dVar14;
  ImVec2 p2;
  ImVec2 p12;
  ImVec2 p1;
  ImVec2 local_70;
  ImVec2 local_68;
  ImDrawList *local_60;
  undefined1 local_58 [8];
  TransformerLogLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar8 = GImPlot;
  pIVar6 = GImPlot->CurrentPlot;
  local_60 = DrawList;
  if (((pIVar6->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar10 = getter->Count;
    local_48 = iVar10 + -1;
    local_40 = line_weight * 0.5;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    dVar2 = *(double *)
             ((long)getter->Ys +
             (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    dVar13 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar6->XAxis).Range.Min);
    dVar3 = pIVar8->LogDenX;
    pIVar6 = pIVar8->CurrentPlot;
    dVar4 = (pIVar6->XAxis).Range.Min;
    dVar5 = (pIVar6->XAxis).Range.Max;
    dVar14 = log10(dVar2 / pIVar6->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar6 = pIVar8->CurrentPlot;
    dVar2 = pIVar6->YAxis[iVar10].Range.Min;
    local_3c.x = (float)((((double)(float)(dVar13 / dVar3) * (dVar5 - dVar4) + dVar4) -
                         (pIVar6->XAxis).Range.Min) * pIVar8->Mx +
                        (double)pIVar8->PixelRange[iVar10].Min.x);
    local_3c.y = (float)((((double)(float)(dVar14 / pIVar8->LogDenY[iVar10]) *
                           (pIVar6->YAxis[iVar10].Range.Max - dVar2) + dVar2) - dVar2) *
                         pIVar8->My[iVar10] + (double)pIVar8->PixelRange[iVar10].Min.y);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterYs<double>,ImPlot::TransformerLogLog>>
              ((StairsRenderer<ImPlot::GetterYs<double>,_ImPlot::TransformerLogLog> *)local_58,
               local_60,&pIVar6->PlotRect);
  }
  else {
    iVar10 = getter->Count;
    dVar2 = *(double *)
             ((long)getter->Ys +
             (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride);
    dVar13 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar6->XAxis).Range.Min);
    dVar3 = pIVar8->LogDenX;
    pIVar6 = pIVar8->CurrentPlot;
    dVar4 = (pIVar6->XAxis).Range.Min;
    dVar5 = (pIVar6->XAxis).Range.Max;
    dVar14 = log10(dVar2 / pIVar6->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar6 = pIVar8->CurrentPlot;
    dVar2 = pIVar6->YAxis[iVar10].Range.Min;
    local_58._0_4_ =
         (undefined4)
         ((((double)(float)(dVar13 / dVar3) * (dVar5 - dVar4) + dVar4) - (pIVar6->XAxis).Range.Min)
          * pIVar8->Mx + (double)pIVar8->PixelRange[iVar10].Min.x);
    local_58._4_4_ =
         (float)((((double)(float)(dVar14 / pIVar8->LogDenY[iVar10]) *
                   (pIVar6->YAxis[iVar10].Range.Max - dVar2) + dVar2) - dVar2) * pIVar8->My[iVar10]
                + (double)pIVar8->PixelRange[iVar10].Min.y);
    iVar10 = getter->Count;
    if (1 < iVar10) {
      iVar11 = 1;
      do {
        pIVar9 = GImPlot;
        dVar2 = *(double *)
                 ((long)getter->Ys +
                 (long)(((getter->Offset + iVar11) % iVar10 + iVar10) % iVar10) *
                 (long)getter->Stride);
        dVar13 = log10(((double)iVar11 * getter->XScale + getter->X0) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        dVar3 = pIVar9->LogDenX;
        pIVar6 = pIVar9->CurrentPlot;
        dVar4 = (pIVar6->XAxis).Range.Min;
        dVar5 = (pIVar6->XAxis).Range.Max;
        dVar14 = log10(dVar2 / pIVar6->YAxis[transformer->YAxis].Range.Min);
        this = local_60;
        iVar10 = transformer->YAxis;
        pIVar6 = pIVar9->CurrentPlot;
        dVar2 = pIVar6->YAxis[iVar10].Range.Min;
        local_70.x = (float)((((double)(float)(dVar13 / dVar3) * (dVar5 - dVar4) + dVar4) -
                             (pIVar6->XAxis).Range.Min) * pIVar9->Mx +
                            (double)pIVar9->PixelRange[iVar10].Min.x);
        fVar12 = (float)((((double)(float)(dVar14 / pIVar9->LogDenY[iVar10]) *
                           (pIVar6->YAxis[iVar10].Range.Max - dVar2) + dVar2) - dVar2) *
                         pIVar9->My[iVar10] + (double)pIVar9->PixelRange[iVar10].Min.y);
        local_70.y = fVar12;
        pIVar6 = pIVar8->CurrentPlot;
        fVar7 = (float)local_58._4_4_;
        if (fVar12 <= (float)local_58._4_4_) {
          fVar7 = fVar12;
        }
        if ((fVar7 < (pIVar6->PlotRect).Max.y) &&
           (fVar7 = (float)(~-(uint)(fVar12 <= (float)local_58._4_4_) & (uint)fVar12 |
                           -(uint)(fVar12 <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar7 && fVar7 != *pfVar1)) {
          fVar7 = (float)local_58._0_4_;
          if (local_70.x <= (float)local_58._0_4_) {
            fVar7 = local_70.x;
          }
          if ((fVar7 < (pIVar6->PlotRect).Max.x) &&
             (fVar7 = (float)(~-(uint)(local_70.x <= (float)local_58._0_4_) & (uint)local_70.x |
                             local_58._0_4_ & -(uint)(local_70.x <= (float)local_58._0_4_)),
             (pIVar6->PlotRect).Min.x <= fVar7 && fVar7 != (pIVar6->PlotRect).Min.x)) {
            local_68.y = (float)local_58._4_4_;
            local_68.x = local_70.x;
            ImDrawList::AddLine(local_60,(ImVec2 *)local_58,&local_68,col,line_weight);
            ImDrawList::AddLine(this,&local_68,&local_70,col,line_weight);
          }
        }
        local_58._0_4_ = local_70.x;
        local_58._4_4_ = local_70.y;
        iVar11 = iVar11 + 1;
        iVar10 = getter->Count;
      } while (iVar11 < iVar10);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}